

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O2

int Abc_NtkIsTrueCex(Abc_Ntk_t *pNtk,Abc_Cex_t *pCex)

{
  Abc_NtkType_t AVar1;
  int iVar2;
  Aig_Man_t *pAig;
  
  AVar1 = pNtk->ntkType;
  if (AVar1 != ABC_NTK_STRASH) {
    pNtk = Abc_NtkStrash(pNtk,0,0,0);
  }
  iVar2 = 0;
  pAig = Abc_NtkToDar(pNtk,0,1);
  if (pAig != (Aig_Man_t *)0x0) {
    iVar2 = Saig_ManVerifyCex(pAig,pCex);
    Aig_ManStop(pAig);
  }
  if (AVar1 != ABC_NTK_STRASH) {
    Abc_NtkDelete(pNtk);
  }
  return iVar2;
}

Assistant:

int Abc_NtkIsTrueCex( Abc_Ntk_t * pNtk, Abc_Cex_t * pCex )
{
    extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
    Aig_Man_t * pMan;
    int status = 0, fStrashed = 0;
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        pNtk = Abc_NtkStrash(pNtk, 0, 0, 0);
        fStrashed = 1;
    }
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan )
    {
        status = Saig_ManVerifyCex( pMan, pCex );
        Aig_ManStop( pMan );
    }
    if ( fStrashed )
        Abc_NtkDelete( pNtk );
    return status;
}